

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_property(nk_command_buffer *out,nk_style_property *style,nk_rect *bounds,nk_rect *label
                     ,nk_flags state,char *name,int len,nk_user_font *font)

{
  nk_style_property *local_50;
  nk_style_item *background;
  nk_text text;
  char *name_local;
  nk_flags state_local;
  nk_rect *label_local;
  nk_rect *bounds_local;
  nk_style_property *style_local;
  nk_command_buffer *out_local;
  
  if ((state & 0x20) == 0) {
    if ((state & 0x10) == 0) {
      text.padding.y = *(float *)&style->label_normal;
      local_50 = style;
    }
    else {
      local_50 = (nk_style_property *)&style->hover;
      text.padding.y = *(float *)&style->label_hover;
    }
  }
  else {
    local_50 = (nk_style_property *)&style->active;
    text.padding.y = *(float *)&style->label_active;
  }
  text._8_8_ = name;
  if ((local_50->normal).type == NK_STYLE_ITEM_IMAGE) {
    nk_draw_image(out,*bounds,&(local_50->normal).data.image,(nk_color)0xffffffff);
    text.padding.x = (float)nk_rgba(0,0,0,0);
  }
  else {
    text.padding.x = *(float *)&(local_50->normal).data.color;
    nk_fill_rect(out,*bounds,style->rounding,(local_50->normal).data.color);
    nk_stroke_rect(out,*bounds,style->rounding,style->border,(local_50->normal).data.color);
  }
  background = (nk_style_item *)nk_vec2(0.0,0.0);
  nk_widget_text(out,*label,(char *)text._8_8_,len,(nk_text *)&background,0x12,font);
  return;
}

Assistant:

NK_LIB void
nk_draw_property(struct nk_command_buffer *out, const struct nk_style_property *style,
    const struct nk_rect *bounds, const struct nk_rect *label, nk_flags state,
    const char *name, int len, const struct nk_user_font *font)
{
    struct nk_text text;
    const struct nk_style_item *background;

    /* select correct background and text color */
    if (state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->active;
        text.text = style->label_active;
    } else if (state & NK_WIDGET_STATE_HOVER) {
        background = &style->hover;
        text.text = style->label_hover;
    } else {
        background = &style->normal;
        text.text = style->label_normal;
    }

    /* draw background */
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(out, *bounds, &background->data.image, nk_white);
        text.background = nk_rgba(0,0,0,0);
    } else {
        text.background = background->data.color;
        nk_fill_rect(out, *bounds, style->rounding, background->data.color);
        nk_stroke_rect(out, *bounds, style->rounding, style->border, background->data.color);
    }

    /* draw label */
    text.padding = nk_vec2(0,0);
    nk_widget_text(out, *label, name, len, &text, NK_TEXT_CENTERED, font);
}